

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skynet_server.c
# Opt level: O3

uint32_t skynet_current_handle(void)

{
  void *pvVar1;
  
  if (G_NODE.init != 0) {
    pvVar1 = pthread_getspecific(G_NODE.handle_key);
    return (uint32_t)pvVar1;
  }
  return 0xffffffff;
}

Assistant:

uint32_t 
skynet_current_handle(void) {
	if (G_NODE.init) {
		void * handle = pthread_getspecific(G_NODE.handle_key);
		return (uint32_t)(uintptr_t)handle;
	} else {
		uint32_t v = (uint32_t)(-THREAD_MAIN);
		return v;
	}
}